

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyImplPrivate::backendNotify
          (QNetworkReplyImplPrivate *this,InternalNotifications notification)

{
  QObject *pQVar1;
  __normal_iterator<const_QNetworkReplyImplPrivate::InternalNotifications_*,_std::vector<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>_>
  _Var2;
  QEvent *this_00;
  iterator __position;
  long in_FS_OFFSET;
  InternalNotifications local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QNetworkReplyPrivate).field_0x8;
  local_24 = notification;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<QNetworkReplyImplPrivate::InternalNotifications_const*,std::vector<QNetworkReplyImplPrivate::InternalNotifications,std::allocator<QNetworkReplyImplPrivate::InternalNotifications>>>,__gnu_cxx::__ops::_Iter_equals_val<QNetworkReplyImplPrivate::InternalNotifications_const>>
                    ((this->pendingNotifications).
                     super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->pendingNotifications).
                     super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->pendingNotifications).
       super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->pendingNotifications).
        super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<QNetworkReplyImplPrivate::InternalNotifications,std::allocator<QNetworkReplyImplPrivate::InternalNotifications>>
      ::_M_realloc_insert<QNetworkReplyImplPrivate::InternalNotifications_const&>
                ((vector<QNetworkReplyImplPrivate::InternalNotifications,std::allocator<QNetworkReplyImplPrivate::InternalNotifications>>
                  *)&this->pendingNotifications,__position,&local_24);
      __position._M_current =
           (this->pendingNotifications).
           super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = local_24;
      __position._M_current = __position._M_current + 1;
      (this->pendingNotifications).
      super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
    }
  }
  if ((long)__position._M_current -
      (long)(this->pendingNotifications).
            super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
            ._M_impl.super__Vector_impl_data._M_start == 4) {
    this_00 = (QEvent *)operator_new(0x10);
    QEvent::QEvent(this_00,NetworkReplyUpdated);
    QCoreApplication::postEvent(pQVar1,this_00,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::backendNotify(InternalNotifications notification)
{
    Q_Q(QNetworkReplyImpl);
    const auto it = std::find(pendingNotifications.cbegin(), pendingNotifications.cend(), notification);
    if (it == pendingNotifications.cend())
        pendingNotifications.push_back(notification);

    if (pendingNotifications.size() == 1)
        QCoreApplication::postEvent(q, new QEvent(QEvent::NetworkReplyUpdated));
}